

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::TraceUpdateConstructorCache
               (ConstructorCache *ctorCache,FunctionBody *ctorBody,bool updated,char16 *reason)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar2;
  undefined4 extraout_var;
  char16 *pcVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)ctorBody);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)ctorBody);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,ConstructorCachePhase,sourceContextId,functionId
                           );
  if (bVar1) {
    iVar2 = (*(ctorBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(ctorBody);
    pcVar4 = L"did not update";
    pcVar3 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)ctorBody,(wchar (*) [42])local_98);
    if (updated) {
      pcVar4 = L"updated";
    }
    pcVar5 = L", because";
    if (updated) {
      pcVar5 = L"";
    }
    Output::Print(L"CtorCache: %s cache (0x%p) for ctor %s (%s)%s %s: ",pcVar4,ctorBody,
                  CONCAT44(extraout_var,iVar2),pcVar3,pcVar5,reason);
    ConstructorCache::Dump(ctorCache);
    Output::Print(L"\n");
    Output::Flush();
  }
  return;
}

Assistant:

void JavascriptOperators::TraceUpdateConstructorCache(const ConstructorCache* ctorCache, const FunctionBody* ctorBody, bool updated, const char16* reason)
    {
#if DBG_DUMP
        if (PHASE_TRACE(Js::ConstructorCachePhase, ctorBody))
        {
            const char16* ctorName = ctorBody->GetDisplayName();
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("CtorCache: %s cache (0x%p) for ctor %s (%s)%s %s: "),
                updated ? _u("updated") : _u("did not update"), ctorBody, ctorName,
                ctorBody ? const_cast<Js::FunctionBody *>(ctorBody)->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                updated ? _u("") : _u(", because") , reason);
            ctorCache->Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }